

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

LY_ERR lyd_validate_subtree
                 (lyd_node *root,ly_set *node_when,ly_set *node_types,ly_set *meta_types,
                 ly_set *ext_node,ly_set *ext_val,uint32_t val_opts,uint32_t int_opts,
                 ly_ht *getnext_ht,lyd_node **diff)

{
  lyd_node_inner *plVar1;
  LY_ERR LVar2;
  LY_ERR LVar3;
  lysc_node *plVar4;
  lyd_node **pplVar5;
  lysc_when *plVar6;
  lyd_node_inner *plVar7;
  lyd_node *node;
  lyd_node *sibling;
  lyd_node *node_00;
  lyd_meta *object;
  lysc_type *type;
  
  if (root == (lyd_node *)0x0) {
    LVar3 = LY_SUCCESS;
  }
  else {
    sibling = root;
    if ((root->flags & 8) == 0) {
      LVar3 = LY_SUCCESS;
      node_00 = root;
      do {
        plVar4 = node_00->schema;
        if (plVar4 == (lysc_node *)0x0) {
LAB_001b5a10:
          sibling = *(lyd_node **)(node_00 + 1);
          if (sibling == (lyd_node *)0x0) goto LAB_001b5a19;
        }
        else {
          object = node_00->meta;
          if (object != (lyd_meta *)0x0) {
            do {
              lyplg_ext_get_storage(object->annotation,0x2e0000,8,&type);
              if ((type->plugin->validate != (lyplg_type_validate_clb)0x0) &&
                 (LVar2 = ly_set_add(meta_types,object,'\x01',(uint32_t *)0x0), LVar2 != LY_SUCCESS)
                 ) {
                return LVar2;
              }
              object = object->next;
            } while (object != (lyd_meta *)0x0);
            plVar4 = node_00->schema;
          }
          if (((plVar4->nodetype & 0xc) == 0) ||
             ((plVar4[1].parent)->parent->parent == (lysc_node *)0x0)) {
            if ((plVar4->nodetype & 0x711) != 0) {
              pplVar5 = lyd_node_child_p(node_00);
              LVar2 = lyd_validate_new(pplVar5,node_00->schema,(lys_module *)0x0,
                                       (lysc_ext_instance *)0x0,val_opts,int_opts,getnext_ht,diff);
              if (LVar2 != LY_SUCCESS) {
                if (LVar2 != LY_EVALID) {
                  return LVar2;
                }
                LVar3 = LY_EVALID;
                if ((val_opts & 4) == 0) {
                  return LY_EVALID;
                }
              }
              pplVar5 = lyd_node_child_p(node_00);
              LVar2 = lyd_new_implicit(node_00,pplVar5,(lysc_node *)0x0,(lys_module *)0x0,
                                       (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,
                                       val_opts >> 1 & 8 | val_opts & 1,getnext_ht,diff);
              goto LAB_001b59c0;
            }
          }
          else {
            LVar2 = ly_set_add(node_types,node_00,'\x01',(uint32_t *)0x0);
LAB_001b59c0:
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
          }
          plVar6 = lysc_has_when(node_00->schema);
          if ((plVar6 != (lysc_when *)0x0) &&
             (LVar2 = ly_set_add(node_when,node_00,'\x01',(uint32_t *)0x0), LVar2 != LY_SUCCESS)) {
            return LVar2;
          }
          LVar2 = lyd_validate_node_ext(node_00,ext_node);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          if ((node_00->schema == (lysc_node *)0x0) || ((node_00->schema->nodetype & 0x711) != 0))
          goto LAB_001b5a10;
LAB_001b5a19:
          if (node_00 == root) {
            return LVar3;
          }
          sibling = node_00->next;
          if (sibling == (lyd_node *)0x0) {
            plVar7 = node_00->parent;
            do {
              plVar1 = (plVar7->field_0).node.parent;
              if (plVar1 == root->parent) {
                return LVar3;
              }
              sibling = (plVar7->field_0).node.next;
              plVar7 = plVar1;
            } while (sibling == (lyd_node *)0x0);
          }
        }
        node_00 = sibling;
      } while ((sibling->flags & 8) == 0);
    }
    LVar3 = lyd_validate_nested_ext(sibling,ext_val);
  }
  return LVar3;
}

Assistant:

static LY_ERR
lyd_validate_subtree(struct lyd_node *root, struct ly_set *node_when, struct ly_set *node_types,
        struct ly_set *meta_types, struct ly_set *ext_node, struct ly_set *ext_val, uint32_t val_opts,
        uint32_t int_opts, struct ly_ht *getnext_ht, struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    const struct lyd_meta *meta;
    const struct lysc_type *type;
    struct lyd_node *node;
    uint32_t impl_opts;

    LYD_TREE_DFS_BEGIN(root, node) {
        if (node->flags & LYD_EXT) {
            /* validate using the extension instance callback */
            return lyd_validate_nested_ext(node, ext_val);
        }

        if (!node->schema) {
            /* do not validate opaque nodes */
            goto next_node;
        }

        LY_LIST_FOR(node->meta, meta) {
            lyplg_ext_get_storage(meta->annotation, LY_STMT_TYPE, sizeof type, (const void **)&type);
            if (type->plugin->validate) {
                /* metadata type resolution */
                r = ly_set_add(meta_types, (void *)meta, 1, NULL);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            }
        }

        if ((node->schema->nodetype & LYD_NODE_TERM) && ((struct lysc_node_leaf *)node->schema)->type->plugin->validate) {
            /* node type resolution */
            r = ly_set_add(node_types, (void *)node, 1, NULL);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        } else if (node->schema->nodetype & LYD_NODE_INNER) {
            /* new node validation, autodelete */
            r = lyd_validate_new(lyd_node_child_p(node), node->schema, NULL, NULL, val_opts, int_opts, getnext_ht, diff);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* add nested defaults */
            impl_opts = 0;
            if (val_opts & LYD_VALIDATE_NO_STATE) {
                impl_opts |= LYD_IMPLICIT_NO_STATE;
            }
            if (val_opts & LYD_VALIDATE_NO_DEFAULTS) {
                impl_opts |= LYD_IMPLICIT_NO_DEFAULTS;
            }
            r = lyd_new_implicit(node, lyd_node_child_p(node), NULL, NULL, NULL, NULL, NULL, impl_opts, getnext_ht, diff);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }

        if (lysc_has_when(node->schema)) {
            /* when evaluation */
            r = ly_set_add(node_when, (void *)node, 1, NULL);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }

        /* store for ext instance node validation, if needed */
        r = lyd_validate_node_ext(node, ext_node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

next_node:
        LYD_TREE_DFS_END(root, node);
    }

cleanup:
    return rc;
}